

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_item(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
         item_event_visitor *visitor,error_code *ec)

{
  bool bVar1;
  byte bVar2;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *pbVar3;
  reference this_00;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> *v;
  char *__str;
  size_type sVar5;
  ulong length;
  error_code *in_RDX;
  error_code *in_RSI;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  type tVar6;
  semantic_tag tag_2;
  double val_3;
  uint64_t val_2;
  type result;
  read_byte_string_from_source read_1;
  semantic_tag tag_1;
  int64_t val_1;
  semantic_tag tag;
  read_byte_string_from_buffer read;
  value_type *str;
  size_type index;
  error_code *in_stack_000001e8;
  item_event_visitor *in_stack_000001f0;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_000001f8;
  uint64_t val;
  uint8_t info;
  cbor_major_type major_type;
  char_result<unsigned_char> c;
  error_code *in_stack_fffffffffffffdd8;
  undefined1 __x;
  error_code *in_stack_fffffffffffffde0;
  semantic_tag tag_00;
  stream_source<unsigned_char> *in_stack_fffffffffffffde8;
  undefined6 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  size_t in_stack_fffffffffffffdf8;
  stream_source<unsigned_char> *in_stack_fffffffffffffe00;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffe08;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe20;
  error_code *in_stack_fffffffffffffe28;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffe30;
  uint8_t info_00;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  semantic_tag in_stack_fffffffffffffe57;
  item_event_visitor *in_stack_fffffffffffffe58;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffe60;
  error_code *in_stack_fffffffffffffe90;
  string_type *in_stack_fffffffffffffe98;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_fffffffffffffea0;
  reference local_150;
  undefined1 local_139;
  double local_138;
  uint64_t local_130;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  char *local_118;
  conv_errc local_110;
  read_byte_string_from_source in_stack_ffffffffffffff00;
  string_type *in_stack_ffffffffffffff08;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff10;
  reference local_e8;
  undefined1 local_d1;
  int64_t local_d0;
  reference local_c8;
  reference local_b8;
  undefined1 local_a1;
  error_code *in_stack_ffffffffffffff70;
  string_type *in_stack_ffffffffffffff78;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  reference local_60;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *local_58;
  reference local_50;
  byte local_39;
  reference local_38;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *local_28;
  byte local_1c;
  cbor_major_type local_1b;
  char_result<unsigned_char> local_1a;
  error_code *local_18;
  error_code *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  read_tags(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  bVar1 = std::error_code::operator_cast_to_bool(local_18);
  if (!bVar1) {
    local_1a = stream_source<unsigned_char>::peek(in_stack_fffffffffffffde8);
    if (((ushort)local_1a & 0x100) == 0) {
      local_1b = get_major_type(local_1a.value);
      local_1c = get_additional_information_value(local_1a.value);
      pbVar3 = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
               (ulong)local_1b;
      switch(pbVar3) {
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x0:
        local_28 = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                    *)get_uint64_value(in_stack_fffffffffffffe08,
                                       (error_code *)in_stack_fffffffffffffe00);
        bVar1 = std::error_code::operator_cast_to_bool(local_18);
        if (bVar1) {
          return;
        }
        bVar1 = std::
                vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                ::empty((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdf7,
                                    CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)));
        local_39 = 0;
        bVar2 = false;
        if (!bVar1) {
          std::bitset<3UL>::operator[]
                    ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          local_39 = 1;
          bVar2 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffffde0);
        }
        if ((local_39 & 1) != 0) {
          std::bitset<3UL>::reference::~reference(&local_38);
        }
        if ((bVar2 & 1) == 0) {
          local_a1 = 0;
          std::bitset<3UL>::operator[]
                    ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          bVar2 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffffde0);
          std::bitset<3UL>::reference::~reference(&local_b8);
          if ((bVar2 & 1) != 0) {
            if (in_RDI->raw_tag_ == 1) {
              local_a1 = 5;
            }
            std::bitset<3UL>::operator[]
                      ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
            std::bitset<3UL>::reference::operator=
                      ((reference *)in_stack_fffffffffffffde0,
                       SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
            std::bitset<3UL>::reference::~reference(&local_c8);
          }
          basic_item_event_visitor<char>::uint64_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                     (uint64_t)in_stack_fffffffffffffde8,
                     (semantic_tag)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                     (ser_context *)in_stack_fffffffffffffdd8,(error_code *)0x2e05c5);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        }
        else {
          std::bitset<3UL>::operator[]
                    ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          std::bitset<3UL>::reference::operator=
                    ((reference *)in_stack_fffffffffffffde0,
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
          std::bitset<3UL>::reference::~reference(&local_50);
          pbVar3 = local_28;
          this_00 = std::
                    vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                    ::back((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                            *)in_stack_fffffffffffffde0);
          pbVar4 = (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                    *)std::
                      vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                      ::size(this_00);
          if (pbVar4 <= pbVar3) {
            std::error_code::operator=
                      ((error_code *)
                       CONCAT17(in_stack_fffffffffffffdf7,
                                CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                       (cbor_errc)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            in_RDI->more_ = false;
            return;
          }
          local_58 = local_28;
          std::
          vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
          ::back((vector<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
                  *)in_stack_fffffffffffffde0);
          local_60 = std::
                     vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                     ::at((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                           *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
          if (local_60->type == byte_string) {
            byte_string_view::
            byte_string_view<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((byte_string_view *)
                       CONCAT17(in_stack_fffffffffffffdf7,
                                CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffde8,
                       (type_conflict)((ulong)in_stack_fffffffffffffde0 >> 0x20));
            read_byte_string_from_buffer::read_byte_string_from_buffer
                      ((read_byte_string_from_buffer *)&stack0xffffffffffffff80,
                       (byte_string_view *)&stack0xffffffffffffff70);
            basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
            write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_buffer>
                      ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                        *)val,(read_byte_string_from_buffer *)in_stack_000001f8,in_stack_000001f0,
                       in_stack_000001e8);
            bVar1 = std::error_code::operator_cast_to_bool(local_18);
            if (bVar1) {
              return;
            }
          }
          else {
            v = (basic_string_view<char,_std::char_traits<char>_> *)std::__cxx11::string::data();
            sVar5 = std::__cxx11::string::length();
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_70,(char *)v,sVar5);
            handle_string(pbVar3,(item_event_visitor *)local_10,v,
                          (error_code *)
                          CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
            bVar1 = std::error_code::operator_cast_to_bool(local_18);
            if (bVar1) {
              return;
            }
          }
        }
        break;
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x1:
        local_d0 = get_int64_value((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffe3f,
                                               CONCAT16(in_stack_fffffffffffffe3e,
                                                        in_stack_fffffffffffffe38)),
                                   (error_code *)in_stack_fffffffffffffe30);
        bVar1 = std::error_code::operator_cast_to_bool(local_18);
        if (bVar1) {
          return;
        }
        local_d1 = 0;
        std::bitset<3UL>::operator[]
                  ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)in_stack_fffffffffffffde0);
        std::bitset<3UL>::reference::~reference(&local_e8);
        if ((bVar2 & 1) != 0) {
          if (in_RDI->raw_tag_ == 1) {
            local_d1 = 5;
          }
          std::bitset<3UL>::operator[]
                    ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          std::bitset<3UL>::reference::operator=
                    ((reference *)in_stack_fffffffffffffde0,
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
          std::bitset<3UL>::reference::~reference((reference *)&stack0xffffffffffffff08);
        }
        basic_item_event_visitor<char>::int64_value
                  ((basic_item_event_visitor<char> *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (int64_t)in_stack_fffffffffffffde8,
                   (semantic_tag)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                   (ser_context *)in_stack_fffffffffffffdd8,(error_code *)0x2e06d3);
        in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        break;
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x2:
        read_byte_string_from_source::read_byte_string_from_source
                  ((read_byte_string_from_source *)&stack0xffffffffffffff00,in_RDI);
        basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
        write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_source>
                  (in_stack_000001f8,(read_byte_string_from_source)val,in_stack_000001f0,
                   in_stack_000001e8);
        bVar1 = std::error_code::operator_cast_to_bool(local_18);
        if (bVar1) {
          return;
        }
        break;
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x3:
        std::__cxx11::string::clear();
        read_text_string(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                         in_stack_fffffffffffffe90);
        bVar1 = std::error_code::operator_cast_to_bool(local_18);
        if (bVar1) {
          return;
        }
        std::__cxx11::string::data();
        std::__cxx11::string::size();
        tVar6 = unicode_traits::validate<char>
                          ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        local_118 = tVar6.ptr;
        local_110 = tVar6.ec;
        if (local_110 != success) {
          std::error_code::operator=
                    ((error_code *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                     (cbor_errc)((ulong)in_stack_fffffffffffffde8 >> 0x20));
          in_RDI->more_ = false;
          return;
        }
        __str = (char *)std::__cxx11::string::data();
        sVar5 = std::__cxx11::string::length();
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_128,__str,sVar5);
        handle_string(in_stack_fffffffffffffe30,(item_event_visitor *)in_stack_fffffffffffffe28,
                      in_stack_fffffffffffffe20,
                      (error_code *)
                      CONCAT17(in_stack_fffffffffffffe1f,
                               CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
        bVar1 = std::error_code::operator_cast_to_bool(local_18);
        if (bVar1) {
          return;
        }
        break;
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x4:
        std::bitset<3UL>::operator[]
                  ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
        info_00 = (uint8_t)((ulong)in_stack_fffffffffffffe30 >> 0x38);
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)in_stack_fffffffffffffde0);
        std::bitset<3UL>::reference::~reference((reference *)&stack0xfffffffffffffe90);
        if ((bVar2 & 1) == 0) {
          begin_array(pbVar3,(item_event_visitor *)
                             CONCAT17(in_stack_fffffffffffffe3f,
                                      CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38))
                      ,info_00,in_stack_fffffffffffffe28);
        }
        else {
          in_stack_fffffffffffffde8 = (stream_source<unsigned_char> *)in_RDI->raw_tag_;
          if (in_stack_fffffffffffffde8 == (stream_source<unsigned_char> *)0x4) {
            std::__cxx11::string::clear();
            read_decimal_fraction
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                      );
            bVar1 = std::error_code::operator_cast_to_bool(local_18);
            if (bVar1) {
              return;
            }
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&in_RDI->text_buffer_);
            basic_item_event_visitor<char>::string_value
                      ((basic_item_event_visitor<char> *)
                       CONCAT17(in_stack_fffffffffffffdf7,CONCAT16(bVar2,in_stack_fffffffffffffdf0))
                       ,(string_view_type *)in_stack_fffffffffffffde8,
                       (semantic_tag)((ulong)local_10 >> 0x38),
                       (ser_context *)in_stack_fffffffffffffdd8,(error_code *)0x2e0c93);
            in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
            in_stack_fffffffffffffde0 = local_10;
          }
          else if (in_stack_fffffffffffffde8 == (stream_source<unsigned_char> *)0x5) {
            std::__cxx11::string::clear();
            read_bigfloat(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                          (error_code *)in_stack_ffffffffffffff00.source);
            bVar1 = std::error_code::operator_cast_to_bool(local_18);
            if (bVar1) {
              return;
            }
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)&in_RDI->text_buffer_);
            basic_item_event_visitor<char>::string_value
                      ((basic_item_event_visitor<char> *)
                       CONCAT17(in_stack_fffffffffffffdf7,CONCAT16(bVar2,in_stack_fffffffffffffdf0))
                       ,(string_view_type *)in_stack_fffffffffffffde8,
                       (semantic_tag)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                       (ser_context *)local_10,(error_code *)0x2e0d42);
            in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
            in_stack_fffffffffffffdd8 = local_10;
          }
          else if (in_stack_fffffffffffffde8 == (stream_source<unsigned_char> *)0x28) {
            produce_begin_multi_dim
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe57
                       ,(error_code *)in_RDI);
          }
          else if (in_stack_fffffffffffffde8 == (stream_source<unsigned_char> *)0x410) {
            produce_begin_multi_dim
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe57
                       ,(error_code *)in_RDI);
          }
          else {
            begin_array(pbVar3,(item_event_visitor *)
                               CONCAT17(in_stack_fffffffffffffe3f,
                                        CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38
                                                )),info_00,in_stack_fffffffffffffe28);
          }
          std::bitset<3UL>::operator[]
                    ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          std::bitset<3UL>::reference::operator=
                    ((reference *)in_stack_fffffffffffffde0,
                     SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
          std::bitset<3UL>::reference::~reference((reference *)&stack0xfffffffffffffe60);
        }
        break;
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x5:
        begin_object(pbVar3,(item_event_visitor *)
                            CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                     (uint8_t)((ulong)in_stack_fffffffffffffe30 >> 0x38),in_stack_fffffffffffffe28);
        break;
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x6:
      case (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)0x7:
        length = (ulong)(local_1c - 0x14);
        tag_00 = (semantic_tag)((ulong)in_stack_fffffffffffffde8 >> 0x30);
        bVar1 = SUB81((ulong)in_stack_fffffffffffffde8 >> 0x38,0);
        switch(length) {
        case 0:
          basic_item_event_visitor<char>::bool_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),bVar1,
                     tag_00,(ser_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
          stream_source<unsigned_char>::ignore(in_stack_fffffffffffffe00,length);
          break;
        case 1:
          basic_item_event_visitor<char>::bool_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),bVar1,
                     tag_00,(ser_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
          stream_source<unsigned_char>::ignore(in_stack_fffffffffffffe00,length);
          break;
        case 2:
          basic_item_event_visitor<char>::null_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),bVar1,
                     (ser_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
          stream_source<unsigned_char>::ignore(in_stack_fffffffffffffe00,length);
          break;
        case 3:
          basic_item_event_visitor<char>::null_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),bVar1,
                     (ser_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
          stream_source<unsigned_char>::ignore(in_stack_fffffffffffffe00,length);
          break;
        default:
          std::error_code::operator=
                    ((error_code *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                     (cbor_errc)((ulong)in_stack_fffffffffffffde8 >> 0x20));
          in_RDI->more_ = false;
          return;
        case 5:
          local_130 = get_uint64_value(in_stack_fffffffffffffe08,
                                       (error_code *)in_stack_fffffffffffffe00);
          bVar1 = std::error_code::operator_cast_to_bool(local_18);
          if (bVar1) {
            return;
          }
          basic_item_event_visitor<char>::half_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(in_stack_fffffffffffffdf7,
                              CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                     (uint16_t)((ulong)in_stack_fffffffffffffde8 >> 0x30),
                     (semantic_tag)((ulong)in_stack_fffffffffffffde8 >> 0x28),
                     (ser_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
          break;
        case 6:
        case 7:
          local_138 = get_double(in_stack_fffffffffffffe08,(error_code *)in_stack_fffffffffffffe00);
          bVar1 = std::error_code::operator_cast_to_bool(local_18);
          if (bVar1) {
            return;
          }
          local_139 = 0;
          std::bitset<3UL>::operator[]
                    ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
          bVar2 = std::bitset::reference::operator_cast_to_bool
                            ((reference *)in_stack_fffffffffffffde0);
          std::bitset<3UL>::reference::~reference(&local_150);
          if ((bVar2 & 1) != 0) {
            if (in_RDI->raw_tag_ == 1) {
              local_139 = 5;
            }
            std::bitset<3UL>::operator[]
                      ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
            std::bitset<3UL>::reference::operator=
                      ((reference *)in_stack_fffffffffffffde0,
                       SUB81((ulong)in_stack_fffffffffffffdd8 >> 0x38,0));
            std::bitset<3UL>::reference::~reference((reference *)&stack0xfffffffffffffea0);
          }
          basic_item_event_visitor<char>::double_value
                    ((basic_item_event_visitor<char> *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                     (double)in_stack_fffffffffffffde8,
                     (semantic_tag)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                     (ser_context *)in_stack_fffffffffffffdd8,(error_code *)0x2e0b2c);
          in_RDI->more_ = (bool)((in_RDI->cursor_mode_ ^ 0xffU) & 1);
        }
      }
      __x = (undefined1)((ulong)in_stack_fffffffffffffdd8 >> 0x38);
      std::bitset<3UL>::operator[]
                ((bitset<3UL> *)in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      std::bitset<3UL>::reference::operator=((reference *)in_stack_fffffffffffffde0,(bool)__x);
      std::bitset<3UL>::reference::~reference((reference *)&stack0xfffffffffffffe50);
    }
    else {
      std::error_code::operator=
                ((error_code *)
                 CONCAT17(in_stack_fffffffffffffdf7,
                          CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                 (cbor_errc)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      in_RDI->more_ = false;
    }
  }
  return;
}

Assistant:

void read_item(item_event_visitor& visitor, std::error_code& ec)
    {
        read_tags(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (!stringref_map_stack_.empty() && other_tags_[stringref_tag])
                {
                    other_tags_[stringref_tag] = false;
                    if (val >= stringref_map_stack_.back().size())
                    {
                        ec = cbor_errc::stringref_too_large;
                        more_ = false;
                        return;
                    }
                    auto index = static_cast<typename stringref_map::size_type>(val);
                    if (index != val)
                    {
                        ec = cbor_errc::number_too_large;
                        more_ = false;
                        return;
                    }
                    auto& str = stringref_map_stack_.back().at(index);
                    switch (str.type)
                    {
                        case jsoncons::cbor::detail::cbor_major_type::text_string:
                        {
                            handle_string(visitor, jsoncons::basic_string_view<char>(str.str.data(),str.str.length()),ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            break;
                        }
                        case jsoncons::cbor::detail::cbor_major_type::byte_string:
                        {
                            read_byte_string_from_buffer read(byte_string_view(str.bytes));
                            write_byte_string(read, visitor, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            break;
                        }
                        default:
                            JSONCONS_UNREACHABLE();
                            break;
                    }
                }
                else
                {
                    semantic_tag tag = semantic_tag::none;
                    if (other_tags_[item_tag])
                    {
                        if (raw_tag_ == 1)
                        {
                            tag = semantic_tag::epoch_second;
                        }
                        other_tags_[item_tag] = false;
                    }
                    visitor.uint64_value(val, tag, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                semantic_tag tag = semantic_tag::none;
                if (other_tags_[item_tag])
                {
                    if (raw_tag_ == 1)
                    {
                        tag = semantic_tag::epoch_second;
                    }
                    other_tags_[item_tag] = false;
                }
                visitor.int64_value(val, tag, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::byte_string:
            {
                read_byte_string_from_source read(this);
                write_byte_string(read, visitor, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::text_string:
            {
                text_buffer_.clear();

                read_text_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(),text_buffer_.size());
                if (result.ec != unicode_traits::conv_errc())
                {
                    ec = cbor_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                handle_string(visitor, jsoncons::basic_string_view<char>(text_buffer_.data(),text_buffer_.length()),ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                JSONCONS_UNREACHABLE();
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::simple:
            {
                switch (info)
                {
                    case 0x14:
                        visitor.bool_value(false, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x15:
                        visitor.bool_value(true, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x16:
                        visitor.null_value(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x17:
                        visitor.null_value(semantic_tag::undefined, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x19: // Half-Precision Float (two-byte IEEE 754)
                    {
                        uint64_t val = get_uint64_value(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        visitor.half_value(static_cast<uint16_t>(val), semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        break;
                    }
                    case 0x1a: // Single-Precision Float (four-byte IEEE 754)
                    case 0x1b: // Double-Precision Float (eight-byte IEEE 754)
                    {
                        double val = get_double(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        semantic_tag tag = semantic_tag::none;
                        if (other_tags_[item_tag])
                        {
                            if (raw_tag_ == 1)
                            {
                                tag = semantic_tag::epoch_second;
                            }
                            other_tags_[item_tag] = false;
                        }
                        visitor.double_value(val, tag, *this, ec);
                        more_ = !cursor_mode_;
                        break;
                    }
                    default:
                    {
                        ec = cbor_errc::unknown_type;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::array:
            {
                if (other_tags_[item_tag])
                {
                    switch (raw_tag_)
                    {
                        case 0x04:
                            text_buffer_.clear();
                            read_decimal_fraction(text_buffer_, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            visitor.string_value(text_buffer_, semantic_tag::bigdec, *this, ec);
                            more_ = !cursor_mode_;
                            break;
                        case 0x05:
                            text_buffer_.clear();
                            read_bigfloat(text_buffer_, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            visitor.string_value(text_buffer_, semantic_tag::bigfloat, *this, ec);
                            more_ = !cursor_mode_;
                            break;
                        case 40: // row major storage
                            produce_begin_multi_dim(visitor, semantic_tag::multi_dim_row_major, ec);
                            break;
                        case 1040: // column major storage
                            produce_begin_multi_dim(visitor, semantic_tag::multi_dim_column_major, ec);
                            break;
                        default:
                            begin_array(visitor, info, ec);
                            break;
                    }
                    other_tags_[item_tag] = false;
                }
                else
                {
                    begin_array(visitor, info, ec);
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::map:
            {
                begin_object(visitor, info, ec);
                break;
            }
            default:
                break;
        }
        other_tags_[item_tag] = false;
    }